

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O1

void U_to_u8_test(int line,UTF_US32 *str1,UTF_S8 *str2,bool ok)

{
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  UTF_US8 *pUVar6;
  byte bVar7;
  long lVar8;
  byte *pbVar9;
  long lVar10;
  ulong in_R9;
  ulong in_R10;
  byte bVar11;
  uint uVar12;
  byte bVar13;
  UTF_US8 tmp;
  UTF_UC8 buf [256];
  UTF_US8 local_148;
  byte local_128 [256];
  
  pUVar6 = &local_148;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  bVar4 = UTF_U_to_u8<(char)63>(str1,&local_148);
  UTF_test(line,bVar4 == ok);
  iVar5 = std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::compare(&local_148,
                    (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                     *)str2);
  UTF_test(line,iVar5 == 0);
  sVar1 = str1->_M_string_length;
  bVar4 = true;
  if (sVar1 == 0) {
    pbVar9 = local_128;
  }
  else {
    pcVar2 = (str1->_M_dataplus)._M_p;
    pbVar9 = local_128;
    lVar8 = 0;
    lVar10 = 0;
    do {
      uVar12 = *(uint *)((long)pcVar2 + lVar8);
      if (uVar12 < 0x110000) {
        if (uVar12 < 0x80) goto LAB_00102133;
        bVar11 = (byte)uVar12;
        if (uVar12 < 0x800) {
          bVar13 = (byte)(uVar12 >> 6) | 0xc0;
          bVar7 = bVar11 & 0x3f | 0x80;
          in_R10 = 0;
        }
        else if (uVar12 < 0x10000) {
          bVar13 = (byte)(uVar12 >> 0xc) | 0xe0;
          bVar7 = (byte)(uVar12 >> 6) & 0x3f | 0x80;
          in_R10 = (ulong)(bVar11 & 0x3f | 0x80);
          in_R9 = 0;
        }
        else {
          bVar13 = (byte)(uVar12 >> 0x12) | 0xf0;
          bVar7 = (byte)(uVar12 >> 0xc) & 0x3f | 0x80;
          in_R10 = (ulong)((byte)(uVar12 >> 6) & 0x3f | 0x80);
          in_R9 = (ulong)(bVar11 & 0x3f | 0x80);
        }
      }
      else {
        uVar12 = 0x3f;
LAB_00102133:
        bVar13 = (byte)uVar12;
        bVar7 = 0;
      }
      if (lVar10 == 0xff) {
LAB_00102232:
        bVar4 = false;
        break;
      }
      *pbVar9 = bVar13;
      lVar3 = lVar10 + 1;
      if (bVar7 != 0) {
        if (lVar10 + 1 == 0xff) {
          pbVar9 = local_128 + lVar10 + 1;
          goto LAB_00102232;
        }
        local_128[lVar10 + 1] = bVar7;
        lVar3 = lVar10 + 2;
        if ((byte)in_R10 != 0) {
          if (lVar10 + 2 == 0xff) {
            pbVar9 = local_128 + lVar10 + 2;
            goto LAB_00102232;
          }
          local_128[lVar10 + 2] = (byte)in_R10;
          lVar3 = lVar10 + 3;
          if ((byte)in_R9 != 0) {
            if (lVar10 + 3 == 0xff) {
              pbVar9 = local_128 + lVar10 + 3;
              goto LAB_00102232;
            }
            local_128[lVar10 + 3] = (byte)in_R9;
            lVar3 = lVar10 + 4;
          }
        }
      }
      lVar10 = lVar3;
      pbVar9 = local_128 + lVar10;
      lVar8 = lVar8 + 4;
    } while (sVar1 << 2 != lVar8);
  }
  *pbVar9 = 0;
  UTF_test(line,bVar4);
  bVar7 = *local_148._M_dataplus._M_p;
  if (bVar7 != 0) {
    lVar8 = 0;
    do {
      if (local_128[lVar8] == 0) break;
      bVar4 = local_148._M_string_length + 1 == lVar8;
      if ((bVar7 != local_128[lVar8]) || (local_148._M_string_length + 1 == lVar8))
      goto LAB_00102290;
      bVar7 = local_148._M_dataplus._M_p[lVar8 + 1];
      lVar8 = lVar8 + 1;
    } while (bVar7 != 0);
    pUVar6 = (UTF_US8 *)((long)&local_148._M_dataplus._M_p + lVar8);
  }
  bVar4 = bVar7 == *(byte *)((long)pUVar6 + 0x20);
LAB_00102290:
  UTF_test(line,bVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  return;
}

Assistant:

void U_to_u8_test(int line, const UTF_US32& str1, const UTF_S8& str2, bool ok)
{
    UTF_US8 tmp;
    UTF_UC8 buf[256];
    UTF_test(line, UTF_U_to_u8<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == reinterpret_cast<const UTF_US8&>(str2));
    UTF_test(line, UTF_uj32_to_uj8(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj8_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}